

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::SystemTimingCheckSyntax::SystemTimingCheckSyntax
          (SystemTimingCheckSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token name,Token openParen,
          SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *args,Token closeParen,Token semi
          )

{
  undefined4 uVar1;
  bool bVar2;
  TimingCheckArgSyntax *pTVar3;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  SyntaxNode *in_R9;
  TimingCheckArgSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *rhs;
  SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *this_00;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_58;
  undefined1 in_stack_ffffffffffffffb8 [16];
  
  this_00 = (SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)&__end2;
  rhs = (SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)&stack0x00000010;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._4_4_,local_58);
  in_RDI[3].parent = in_RDX;
  in_RDI[3].previewNode = in_RCX;
  *(undefined8 *)(in_RDI + 4) = in_R8;
  in_RDI[4].parent = in_R9;
  SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::SeparatedSyntaxList(this_00,rhs);
  *(_func_int ***)(in_RDI + 7) = (rhs->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[7].parent = *(SyntaxNode **)&(rhs->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[7].previewNode = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  uVar1 = *(undefined4 *)&(this_00->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  in_RDI[8].kind = (this_00->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&in_RDI[8].field_0x4 = uVar1;
  in_RDI[5].parent = in_RDI;
  SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)0x7a9df8);
  SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::end(this_00);
  while( true ) {
    bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::iterator_base<slang::syntax::TimingCheckArgSyntax_*>_>
                      ((self_type *)this_00,
                       (iterator_base<slang::syntax::TimingCheckArgSyntax_*> *)rhs);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pTVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::iterator_base<slang::syntax::TimingCheckArgSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::iterator_base<slang::syntax::TimingCheckArgSyntax_*>,_false>
                          *)0x7a9e37);
    (pTVar3->super_SyntaxNode).parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::iterator_base<slang::syntax::TimingCheckArgSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::iterator_base<slang::syntax::TimingCheckArgSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::iterator_base<slang::syntax::TimingCheckArgSyntax_*>,_false>
                *)this_00);
  }
  return;
}

Assistant:

SystemTimingCheckSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token name, Token openParen, const SeparatedSyntaxList<TimingCheckArgSyntax>& args, Token closeParen, Token semi) :
        MemberSyntax(SyntaxKind::SystemTimingCheck, attributes), name(name), openParen(openParen), args(args), closeParen(closeParen), semi(semi) {
        this->args.parent = this;
        for (auto child : this->args)
            child->parent = this;
    }